

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

LocalFederateId __thiscall
helics::HandleManager::getLocalFedID(HandleManager *this,InterfaceHandle handle)

{
  bool bVar1;
  BaseType BVar2;
  reference pBVar3;
  
  bVar1 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                    (handle.hid,&this->handles);
  BVar2 = -2000000000;
  if (bVar1) {
    pBVar3 = std::
             _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
             ::operator[](&(this->handles).
                           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                           ._M_impl.super__Deque_impl_data._M_start,(long)handle.hid);
    BVar2 = (pBVar3->local_fed_id).fid;
  }
  return (LocalFederateId)BVar2;
}

Assistant:

LocalFederateId HandleManager::getLocalFedID(InterfaceHandle handle) const
{
    auto index = handle.baseValue();
    return (isValidIndex(index, handles)) ? handles[index].local_fed_id : LocalFederateId{};
}